

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  bool bVar1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_00;
  reference ppcVar2;
  cmTargetExport *te;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  cmExportBuildFileGenerator *this_local;
  
  if (this->ExportSet == (cmExportSet *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(targets,&this->Targets);
  }
  else {
    this_00 = cmExportSet::GetTargetExports(this->ExportSet);
    __end2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_00);
    te = (cmTargetExport *)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                       *)&te), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                ::operator*(&__end2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(targets,&(*ppcVar2)->TargetName);
      __gnu_cxx::
      __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<std::string>& targets) const
{
  if (this->ExportSet) {
    for (cmTargetExport* te : *this->ExportSet->GetTargetExports()) {
      targets.push_back(te->TargetName);
    }
    return;
  }
  targets = this->Targets;
}